

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O2

MPP_RET hal_h264e_vepu580_gen_regs(void *hal,HalEncTask *task)

{
  byte bVar1;
  void *__s;
  long lVar2;
  int *piVar3;
  long lVar4;
  EncRcTask *pEVar5;
  MppDevRegOffCfgs *cfgs;
  MppPacket s;
  MppFrame frame;
  undefined8 *puVar6;
  HalBufs bufs;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  short sVar10;
  undefined8 uVar11;
  ushort uVar12;
  MPP_RET MVar13;
  uint uVar14;
  uint uVar15;
  RK_U32 RVar16;
  RK_S32 RVar17;
  MppFrameFormat MVar18;
  RK_U32 RVar19;
  int iVar20;
  RK_U32 offset;
  RK_U32 offset_00;
  uint uVar21;
  int iVar22;
  VepuRgb2YuvCfg *pVVar23;
  MppBuffer pvVar24;
  size_t sVar25;
  size_t sVar26;
  HalBuf *pHVar27;
  HalBuf *pHVar28;
  void *pvVar29;
  ushort *ptr;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  char *fmt;
  undefined4 uVar38;
  int iVar39;
  uint uVar40;
  RK_U32 *pRVar41;
  MppBuffer pvVar42;
  RK_U32 *pRVar43;
  uint uVar44;
  uint uVar45;
  short sVar46;
  int iVar47;
  int iVar48;
  bool bVar49;
  byte bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  long lStackY_d0;
  H264eRplmo rplmo;
  uint local_70;
  uint *local_68;
  uint *local_60;
  
  bVar50 = 0;
  __s = *(void **)((long)hal + 0x1d0);
  lVar2 = *hal;
  piVar3 = *(int **)((long)hal + 0x60);
  lVar35 = *(long *)((long)hal + 0x68);
  lVar4 = *(long *)((long)hal + 0x1e8);
  pEVar5 = task->rc_task;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","frame %d generate regs now","hal_h264e_vepu580_gen_regs",
               (ulong)**(uint **)((long)hal + 0x78));
  }
  uVar15 = 0;
  memset(__s,0,0x1cb8);
  if ((hal_h264e_debug & 2) == 0) {
    uVar37 = 0x8008007000;
    bVar49 = true;
    uVar14 = 0x100;
    uVar40 = 7;
    uVar30 = 0x1f7;
    uVar36 = 0;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_normal");
    bVar49 = (hal_h264e_debug & 2) == 0;
    uVar14 = *(uint *)((long)__s + 0x10) & 0xfffffc00 | 0x100;
    uVar40 = *(uint *)((long)__s + 0x54) | 7;
    uVar36 = *(uint *)((long)__s + 0x14) & 0xfffffffc;
    uVar30 = *(uint *)((long)__s + 0x20) & 0xfffffe00 | 0x1f7;
    uVar15 = *(uint *)((long)__s + 0x24) & 0xfffffe00;
    uVar37 = *(ulong *)((long)__s + 0x30) & (ulong)DAT_0029f1b0 | DAT_0029f1a0;
  }
  *(uint *)((long)__s + 0x10) = uVar14;
  *(uint *)((long)__s + 0x54) = uVar40;
  *(uint *)((long)__s + 0x14) = uVar36;
  *(uint *)((long)__s + 0x20) = uVar30;
  *(uint *)((long)__s + 0x24) = uVar15;
  *(undefined4 *)((long)__s + 0x38) = 0x1fffff;
  *(ulong *)((long)__s + 0x30) = uVar37;
  if (!bVar49) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_normal");
  }
  lVar34 = *hal;
  MVar18 = *(MppFrameFormat *)(lVar34 + 0x24);
  MVar13 = vepu541_set_fmt((VepuFmtCfg *)&rplmo,MVar18);
  uVar11 = rplmo._0_8_;
  RVar17 = rplmo.modification_of_pic_nums_idc;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_prep");
  }
  if (MVar13 != MPP_OK) {
    return MVar13;
  }
  uVar15 = *(uint *)((long)__s + 0xf0);
  uVar14 = (*(int *)(lVar34 + 0xc) + 0xfU >> 3 & 0x7fe) - 1 & 0x7ff;
  *(uint *)((long)__s + 0xf0) = uVar15 & 0xfffff800 | uVar14;
  uVar40 = *(uint *)((long)__s + 0xf4);
  uVar36 = (*(int *)(lVar34 + 0xc) + 0xfU & 0x30) - *(int *)(lVar34 + 0xc) & 0x3f;
  *(uint *)((long)__s + 0xf4) = uVar40 & 0xffffffc0 | uVar36;
  *(uint *)((long)__s + 0xf0) =
       uVar15 & 0xf800f800 | uVar14 |
       (*(int *)(lVar34 + 0x10) * 0x2000 + 0x1e000U & 0x7fe0000) + 0x7ff0000 & 0x7ff0000;
  *(uint *)((long)__s + 0xf4) =
       uVar40 & 0xffc0ffc0 | uVar36 |
       ((*(int *)(lVar34 + 0x10) + 0xfU & 0x30) - *(int *)(lVar34 + 0x10) & 0x3f) << 0x10;
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (local_70 & 0xf) << 4;
  uVar15 = ((uint)(MVar18 != MPP_FMT_YUV400) * 0x80 + (RVar17 & 0xfU) * 4 |
            *(uint *)((long)__s + 0xf8) & 0xffffff40 | rplmo.abs_diff_pic_num_minus1 & 1U) +
           (rplmo.long_term_pic_idx & 1U) * 2;
  *(uint *)((long)__s + 0xf8) = uVar15;
  if ((MVar18 & 0xfffc) < MPP_FMT_YUV_BUTT && (MVar18 & 0xf0000) == MPP_FMT_YUV420SP) {
    uVar15 = uVar15 | 0x40;
  }
  else {
    uVar15 = uVar15 & 0xffffffbf | (uint)(*(int *)(lVar34 + 0x34) == 2) << 6;
  }
  *(uint *)((long)__s + 0xf8) = uVar15;
  if ((MVar18 & 0xf00000) != MPP_FMT_YUV420SP) {
    RVar16 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (RVar16 == 0) {
      RVar16 = *(int *)(lVar34 + 0xc) + 0xfU & 0xfffffff0;
    }
    goto LAB_00214097;
  }
  RVar16 = *(RK_U32 *)(lVar34 + 0x14);
  if (RVar16 != 0) goto LAB_00214097;
  switch(uVar11 & 0xffffffff) {
  case 0:
    RVar16 = *(int *)(lVar34 + 0xc) << 2;
    break;
  case 1:
    RVar16 = *(int *)(lVar34 + 0xc) * 3;
    break;
  case 2:
  case 8:
  case 9:
    RVar16 = *(int *)(lVar34 + 0xc) * 2;
    goto LAB_00214097;
  default:
    RVar16 = *(RK_U32 *)(lVar34 + 0xc);
LAB_00214097:
    sVar46 = (short)RVar16;
    switch(RVar17) {
    default:
      sVar46 = (short)((int)RVar16 / 2);
      if (2 < (uint)RVar17) goto switchD_002140b1_caseD_4;
      goto LAB_00214809;
    case 0xc:
      sVar46 = sVar46 * 2;
    case 4:
    case 6:
    case 0xd:
switchD_002140b1_caseD_4:
      uVar40 = *local_68 & 0x1ff;
      uVar15 = *(uint *)((long)__s + 0xfc);
      *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffffe00 | uVar40;
      uVar14 = (local_68[1] & 0x1ff) << 9;
      *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffc0000 | uVar40 | uVar14;
      *(uint *)((long)__s + 0xfc) =
           uVar15 & 0xf8000000 | uVar40 | uVar14 | (local_68[2] & 0x1ff) << 0x12;
      uVar40 = local_68[3] & 0x1ff;
      uVar15 = *(uint *)((long)__s + 0x100);
      *(uint *)((long)__s + 0x100) = uVar15 & 0xfffffe00 | uVar40;
      uVar14 = (local_68[4] & 0x1ff) << 9;
      *(uint *)((long)__s + 0x100) = uVar15 & 0xfffc0000 | uVar40 | uVar14;
      *(uint *)((long)__s + 0x100) =
           uVar15 & 0xf8000000 | uVar40 | uVar14 | (local_68[5] & 0x1ff) << 0x12;
      uVar40 = local_68[6] & 0x1ff;
      uVar15 = *(uint *)((long)__s + 0x104);
      *(uint *)((long)__s + 0x104) = uVar15 & 0xfffffe00 | uVar40;
      uVar14 = (local_68[7] & 0x1ff) << 9;
      *(uint *)((long)__s + 0x104) = uVar15 & 0xfffc0000 | uVar40 | uVar14;
      *(uint *)((long)__s + 0x104) =
           uVar15 & 0xf8000000 | uVar40 | uVar14 | (local_68[8] & 0x1ff) << 0x12;
      uVar40 = (*local_60 & 0x1f) << 0x10;
      uVar15 = *(uint *)((long)__s + 0x108);
      *(uint *)((long)__s + 0x108) = uVar15 & 0xffe0ffff | uVar40;
      uVar15 = uVar15 & 0xffe000ff | uVar40 | (local_60[1] & 0xff) << 8;
      *(uint *)((long)__s + 0x108) = uVar15;
      *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar15 >> 8),(char)local_60[2]);
    }
    goto LAB_00214205;
  }
  sVar46 = (short)((int)RVar16 / 2);
LAB_00214809:
  pVVar23 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar34 + 0x34),
                            *(MppFrameColorSpace *)(lVar34 + 0x28));
  bVar49 = true;
  if ((hal_h264e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","input color range %d colorspace %d","setup_vepu580_prep",
               (ulong)*(uint *)(lVar34 + 0x34),(ulong)*(uint *)(lVar34 + 0x28));
    bVar49 = (hal_h264e_debug & 4) == 0;
  }
  uVar40 = (ushort)(pVVar23->_2y).b_coeff & 0x1ff;
  uVar15 = *(uint *)((long)__s + 0xfc);
  *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffffe00 | uVar40;
  uVar14 = ((ushort)(pVVar23->_2y).g_coeff & 0x1ff) << 9;
  *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffc0000 | uVar40 | uVar14;
  *(uint *)((long)__s + 0xfc) =
       uVar15 & 0xf8000000 | uVar40 | uVar14 | ((ushort)(pVVar23->_2y).r_coeff & 0x1ff) << 0x12;
  uVar40 = (ushort)(pVVar23->_2u).b_coeff & 0x1ff;
  uVar15 = *(uint *)((long)__s + 0x100);
  *(uint *)((long)__s + 0x100) = uVar15 & 0xfffffe00 | uVar40;
  uVar14 = ((ushort)(pVVar23->_2u).g_coeff & 0x1ff) << 9;
  *(uint *)((long)__s + 0x100) = uVar15 & 0xfffc0000 | uVar40 | uVar14;
  *(uint *)((long)__s + 0x100) =
       uVar15 & 0xf8000000 | uVar40 | uVar14 | ((ushort)(pVVar23->_2u).r_coeff & 0x1ff) << 0x12;
  uVar15 = *(uint *)((long)__s + 0x104);
  uVar40 = (ushort)(pVVar23->_2v).b_coeff & 0x1ff;
  *(uint *)((long)__s + 0x104) = uVar15 & 0xfffffe00 | uVar40;
  uVar14 = ((ushort)(pVVar23->_2v).g_coeff & 0x1ff) << 9;
  *(uint *)((long)__s + 0x104) = uVar15 & 0xfffc0000 | uVar40 | uVar14;
  *(uint *)((long)__s + 0x104) =
       uVar15 & 0xf8000000 | uVar40 | uVar14 | ((ushort)(pVVar23->_2v).r_coeff & 0x1ff) << 0x12;
  uVar15 = *(uint *)((long)__s + 0x108);
  uVar40 = ((ushort)(pVVar23->_2y).offset & 0x1f) << 0x10;
  *(uint *)((long)__s + 0x108) = uVar15 & 0xffe0ffff | uVar40;
  uVar15 = uVar15 & 0xffe000ff | uVar40 | ((ushort)(pVVar23->_2u).offset & 0xff) << 8;
  *(uint *)((long)__s + 0x108) = uVar15;
  *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar15 >> 8),(char)(pVVar23->_2v).offset);
  if (!bVar49) {
    _mpp_log_l(4,"hal_h264e_vepu580","use color range %d colorspace %d","setup_vepu580_prep",
               (ulong)pVVar23->dst_range,(ulong)pVVar23->color);
  }
LAB_00214205:
  uVar40 = (uint)((MVar18 & 0xf00000) != MPP_FMT_YUV420SP) << 0x1e;
  uVar15 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar15 & 0xbfffffff | uVar40;
  *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | RVar16 & 0x1ffff;
  *(short *)((long)__s + 0x118) = sVar46;
  uVar14 = (uint)(0 < *(int *)(lVar34 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x10c) = uVar15 & 0xbbffffff | uVar40 | uVar14;
  *(uint *)((long)__s + 0x10c) =
       uVar15 & 0x83ffffff | uVar40 | uVar14 | (*(uint *)(lVar34 + 0x50) & 3) << 0x1b;
  *(byte *)((long)__s + 0x1d3) = *(byte *)((long)__s + 0x1d3) | 0x80;
  *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xc000c000;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_prep");
  }
  if (*(int *)((long)hal + 0x14) != 1) {
    lVar34 = *(long *)((long)hal + 0x1d0);
    if (*(int *)(lVar4 + 0x2c) == 2) {
      *(undefined8 *)((long)hal + 0x1c4) = 0;
      uVar15 = 0x90010;
      uVar40 = 0;
    }
    else {
      uVar40 = *(uint *)((long)hal + 0x1c4) & 3;
      uVar15 = 0x90030;
    }
    uVar14 = *(uint *)(lVar34 + 0xe4);
    *(uint *)(lVar34 + 0xe4) = uVar14 & 0xfffffffc | uVar40;
    *(uint *)(lVar34 + 0xe4) =
         (uVar14 & 0xf800ffc0 | uVar40 | uVar15) + (*(uint *)((long)hal + 0x1c8) & 3) * 4;
    iVar33 = *(int *)((long)hal + 0x1c4);
    *(int *)((long)hal + 0x1c4) = iVar33 + 1;
    *(int *)((long)hal + 0x1c8) = iVar33;
    if (2 < iVar33) {
      *(undefined4 *)((long)hal + 0x1c4) = 0;
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_codec");
  }
  uVar15 = *(uint *)((long)__s + 0xe0);
  uVar40 = *(uint *)((long)__s + 400);
  *(uint *)((long)__s + 0xe0) = uVar15 & 0xfffffffe;
  *(uint *)((long)__s + 0xe0) =
       (uVar15 & 0xffffffea) + (uint)(0 < *(int *)(lVar4 + 0x20)) * 4 + 0x10;
  uVar15 = *(uint *)(lVar4 + 0x20) & 3;
  *(uint *)((long)__s + 400) = uVar40 & 0xfffffffc | uVar15;
  *(uint *)((long)__s + 400) = (uVar40 & 0xffffff80 | uVar15) + (*(uint *)(lVar4 + 0x24) & 0x1f) * 4
  ;
  uVar15 = *(uint *)((long)__s + 0x194);
  uVar40 = piVar3[10] & 0xf;
  *(uint *)((long)__s + 0x194) = uVar15 & 0xfffffff0 | uVar40;
  uVar14 = (piVar3[0x12] & 1U) << 4;
  *(uint *)((long)__s + 0x194) = uVar15 & 0xffffffe0 | uVar40 | uVar14;
  *(uint *)((long)__s + 0x194) = uVar15 & 0xfffffe00 | uVar40 | uVar14 | (piVar3[0xc] & 0xfU) << 5;
  uVar15 = *(uint *)((long)__s + 0x198);
  uVar40 = *(uint *)(lVar35 + 8) & 1;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xfffffffe | uVar40;
  uVar15 = (uVar15 & 0xfffffffc | uVar40) + (*(uint *)(lVar35 + 0x44) & 1) * 2;
  *(uint *)((long)__s + 0x198) = uVar15;
  uVar15 = (uVar15 & 0xfffffffb) + (*(uint *)(lVar35 + 0x3c) & 1) * 4;
  *(uint *)((long)__s + 0x198) = uVar15;
  uVar40 = *(int *)(lVar35 + 0x14) * 8 + 0x18U & 0x18;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xffffffe7 | uVar40;
  uVar14 = *(int *)(lVar35 + 0x18) * 0x20 + 0x60U & 0x60;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xffffff87 | uVar40 | uVar14;
  uVar36 = (*(uint *)(lVar35 + 0x24) & 0x3f) << 7;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xffffe007 | uVar40 | uVar14 | uVar36;
  uVar30 = (*(uint *)(lVar35 + 0x2c) & 0x1f) << 0xd;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xfffc0007 | uVar40 | uVar14 | uVar36 | uVar30;
  uVar31 = (*(uint *)(lVar35 + 0x34) & 0x1f) << 0x12;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xff800007 | uVar40 | uVar14 | uVar36 | uVar30 | uVar31;
  uVar32 = (*(uint *)(lVar35 + 0x1c) & 1) << 0x17;
  *(uint *)((long)__s + 0x198) =
       uVar15 & 0xff000007 | uVar40 | uVar14 | uVar36 | uVar30 | uVar31 | uVar32;
  *(uint *)((long)__s + 0x198) =
       uVar15 & 0xfe000007 | uVar40 | uVar14 | uVar36 | uVar30 | uVar31 | uVar32 |
       (*(uint *)(lVar35 + 0x38) & 1) << 0x18;
  uVar15 = (*(uint *)((long)__s + 0x19c) & 0xfffffffc) + (uint)(*(int *)(lVar4 + 0x2c) == 2) * 2;
  *(uint *)((long)__s + 0x19c) = uVar15;
  uVar15 = (uVar15 & 0xfffff802) + (*(uint *)(lVar4 + 0x30) & 0xff) * 4;
  *(uint *)((long)__s + 0x19c) = uVar15;
  uVar40 = (*(uint *)(lVar4 + 0x38) & 1) << 0xb;
  *(uint *)((long)__s + 0x19c) = uVar15 & 0xfffff3fe | uVar40;
  uVar14 = (*(uint *)(lVar4 + 0x40) & 3) << 0xc;
  *(uint *)((long)__s + 0x19c) = uVar15 & 0xffffc3fe | uVar40 | uVar14;
  *(uint *)((long)__s + 0x19c) = uVar15 & 0xc3fe | uVar40 | uVar14 | *(int *)(lVar4 + 0x34) << 0x10;
  uVar15 = 0xffff;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar15 = (uint)*(ushort *)(lVar4 + 0x6c);
  }
  *(short *)((long)__s + 0x1a0) = (short)uVar15;
  *(uint *)((long)__s + 0x1a0) = *(int *)(lVar4 + 0x74) << 0x10 | uVar15;
  uVar40 = (*(uint *)(lVar4 + 0x44) & 3) << 0xb;
  uVar15 = *(uint *)((long)__s + 0x1a4);
  *(uint *)((long)__s + 0x1a4) = uVar15 & 0xffffe7ff | uVar40;
  *(uint *)((long)__s + 0x1a4) = uVar15 & 0xffffe07f | uVar40 | (*(uint *)(lVar4 + 0x48) & 0xf) << 7
  ;
  h264e_reorder_rd_rewind(*(H264eReorderInfo **)(lVar4 + 0x58));
  MVar13 = h264e_reorder_rd_op(*(H264eReorderInfo **)(lVar4 + 0x58),&rplmo);
  if (MVar13 == MPP_OK) {
    uVar15 = (rplmo.modification_of_pic_nums_idc & 3U) + (*(uint *)((long)__s + 0x1a4) & 0xfffffff8)
             + 4;
    *(uint *)((long)__s + 0x1a4) = uVar15;
    if ((uint)rplmo.modification_of_pic_nums_idc < 2) {
      RVar17 = rplmo.abs_diff_pic_num_minus1;
    }
    else {
      RVar17 = rplmo.long_term_pic_idx;
      if (rplmo.modification_of_pic_nums_idc != 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","invalid modification_of_pic_nums_idc %d\n",
                   "setup_vepu580_codec");
        goto LAB_00214663;
      }
    }
    *(uint *)((long)__s + 0x1a4) = uVar15 & 0xffff | RVar17 << 0x10;
  }
  else {
    *(uint *)((long)__s + 0x1a4) = *(uint *)((long)__s + 0x1a4) & 0xfff8;
  }
LAB_00214663:
  *(uint *)((long)__s + 0x1a8) = *(uint *)((long)__s + 0x1a8) & 0xe0000000;
  *(undefined4 *)((long)__s + 0x1ac) = 0;
  *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffff000;
  h264e_marking_rd_rewind(*(H264eMarkingInfo **)(lVar4 + 0x60));
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar15 = *(uint *)((long)__s + 0x1a8);
    uVar40 = *(uint *)(lVar4 + 0x7c) & 1;
    *(uint *)((long)__s + 0x1a8) = uVar15 & 0xfffffffe | uVar40;
    *(uint *)((long)__s + 0x1a8) =
         (uVar15 & 0xfffffffc | uVar40) + (*(uint *)(lVar4 + 0x80) & 1) * 2;
  }
  else {
    RVar17 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
    if (RVar17 == 0) {
      *(byte *)((long)__s + 0x1a8) = *(byte *)((long)__s + 0x1a8) | 4;
      h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&rplmo);
      uVar14 = 0;
      uVar15 = 0;
      uVar40 = rplmo.abs_diff_pic_num_minus1;
      switch(rplmo.modification_of_pic_nums_idc) {
      case 1:
        uVar36 = 0x10;
        break;
      case 2:
        uVar36 = 0x20;
        uVar40 = rplmo.long_term_pic_idx;
        break;
      case 3:
        uVar15 = rplmo.abs_diff_view_idx_minus1 & 0xf;
        uVar36 = 0x30;
        break;
      case 4:
        uVar36 = 0x40;
        uVar15 = uVar14;
        uVar40 = local_70;
        break;
      case 5:
        uVar36 = 0x50;
        uVar40 = 0;
        uVar15 = uVar14;
        break;
      case 6:
        uVar36 = 0x60;
        uVar15 = uVar14;
        uVar40 = rplmo.abs_diff_view_idx_minus1;
        break;
      default:
        uVar36 = 0;
        _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
        uVar15 = 0;
        uVar40 = 0;
      }
      *(uint *)((long)__s + 0x1a8) =
           (uVar40 & 0xffff) << 7 | uVar36 | *(uint *)((long)__s + 0x1a8) & 0xff80000f;
      *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffffff0 | uVar15;
      RVar17 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
      if (RVar17 == 0) {
        h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&rplmo);
        uVar40 = 0;
        uVar15 = 0;
        switch(rplmo.modification_of_pic_nums_idc) {
        case 1:
          uVar14 = (uint)(ushort)rplmo.abs_diff_pic_num_minus1;
          uVar38 = 0x800000;
          break;
        case 2:
          uVar14 = rplmo.long_term_pic_idx & 0xffff;
          uVar38 = 0x1000000;
          break;
        case 3:
          uVar14 = (uint)(ushort)rplmo.abs_diff_pic_num_minus1;
          uVar15 = (rplmo.abs_diff_view_idx_minus1 & 0xfU) << 4;
          uVar38 = 0x1800000;
          break;
        case 4:
          uVar14 = local_70 & 0xffff;
          uVar38 = 0x2000000;
          uVar15 = uVar40;
          break;
        case 5:
          uVar38 = 0x2800000;
          uVar14 = 0;
          uVar15 = uVar40;
          break;
        case 6:
          uVar14 = rplmo.abs_diff_view_idx_minus1 & 0xffff;
          uVar38 = 0x3000000;
          uVar15 = uVar40;
          break;
        default:
          uVar38 = 0;
          _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
          uVar14 = 0;
          uVar15 = 0;
        }
        *(ulong *)((long)__s + 0x1a8) =
             CONCAT44(uVar14,uVar38) | *(ulong *)((long)__s + 0x1a8) & (ulong)DAT_0029e8f0;
        *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xffffff0f | uVar15;
        RVar17 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
        if (RVar17 == 0) {
          h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&rplmo);
          uVar40 = 0;
          uVar15 = 0;
          switch(rplmo.modification_of_pic_nums_idc) {
          case 1:
            uVar38 = 0x4000000;
            rplmo.abs_diff_view_idx_minus1 = rplmo.abs_diff_pic_num_minus1;
            break;
          case 2:
            uVar38 = 0x8000000;
            rplmo.abs_diff_view_idx_minus1 = rplmo.long_term_pic_idx;
            break;
          case 3:
            uVar15 = (rplmo.abs_diff_view_idx_minus1 & 0xfU) << 8;
            uVar38 = 0xc000000;
            rplmo.abs_diff_view_idx_minus1 = rplmo.abs_diff_pic_num_minus1;
            break;
          case 4:
            uVar38 = 0x10000000;
            uVar15 = uVar40;
            rplmo.abs_diff_view_idx_minus1 = local_70;
            break;
          case 5:
            uVar38 = 0x14000000;
            rplmo.abs_diff_view_idx_minus1 = 0;
            uVar15 = uVar40;
            break;
          case 6:
            uVar38 = 0x18000000;
            uVar15 = uVar40;
            break;
          default:
            uVar38 = 0;
            _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
            rplmo.abs_diff_view_idx_minus1 = 0;
            uVar15 = 0;
          }
          *(ulong *)((long)__s + 0x1a8) =
               CONCAT44(rplmo.abs_diff_view_idx_minus1 << 0x10,uVar38) |
               *(ulong *)((long)__s + 0x1a8) & (ulong)DAT_0029e900;
          *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffff0ff | uVar15;
        }
      }
    }
  }
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_codec"), (hal_h264e_debug & 2) != 0)
     ) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rdo_pred");
  }
  uVar15 = *(uint *)((long)__s + 600) & 0xfffffff8;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    pRVar41 = h264e_klut_weight;
  }
  else {
    uVar15 = uVar15 | 3;
    pRVar41 = h264e_klut_weight + 4;
  }
  pRVar43 = (RK_U32 *)((long)__s + 0x25c);
  for (lVar34 = 0x18; lVar34 != 0; lVar34 = lVar34 + -1) {
    *pRVar43 = *pRVar41;
    pRVar41 = pRVar41 + (ulong)bVar50 * -2 + 1;
    pRVar43 = pRVar43 + (ulong)bVar50 * -2 + 1;
  }
  *(uint *)((long)__s + 600) = uVar15;
  *(uint *)((long)__s + 0x184) = *(uint *)((long)__s + 0x184) & 0xf000f000 | 0x3f0009;
  if (*piVar3 == 0x42) {
    uVar15 = piVar3[7] < 0x1f | 2;
  }
  else {
    uVar15 = 2;
  }
  uVar40 = *(uint *)((long)__s + 0x180);
  *(uint *)((long)__s + 0x180) = uVar40 & 0xfffffffc | uVar15;
  iVar33 = 0;
  if (*piVar3 < 0x4d) {
    iVar33 = (uint)(*(int *)(lVar35 + 8) == 0) << 3;
  }
  uVar15 = (uVar40 & 0xffffc004 | uVar15) + iVar33 + 0x2010;
  *(uint *)((long)__s + 0x180) = uVar15;
  *(uint *)((long)__s + 0x180) =
       (uVar15 & 0xffc7601f) + (*(uint *)(lVar35 + 0x48) & 3) * 0x100000 + 0x88000;
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rdo_pred"),
     (hal_h264e_debug & 2) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rdo_cfg");
  }
  *(byte *)((long)__s + 0x58c) = *(byte *)((long)__s + 0x58c) | 1;
  *(uint *)((long)__s + 0x658) = *(uint *)((long)__s + 0x658) & 0xf000f000 | 0x2c001c;
  *(uint *)((long)__s + 0x65c) = *(uint *)((long)__s + 0x65c) & 0xfffff000 | 0x48;
  *(uint *)((long)__s + 0x660) = *(uint *)((long)__s + 0x660) & 0xf000f000 | 0x400019;
  *(uint *)((long)__s + 0x664) = *(uint *)((long)__s + 0x664) & 0xf000f000 | 0x400019;
  auVar51 = *(undefined1 (*) [16])((long)__s + 0x668) & _DAT_0029f1e0;
  *(undefined1 (*) [16])((long)__s + 0x668) = _DAT_0029f1f0 | auVar51;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)((long)__s + 0x678);
  auVar52 = auVar52 & ZEXT816(0xff000000ff000000);
  *(ulong *)((long)__s + 0x678) = auVar52._0_8_ | 0x10101000121314;
  *(uint *)((long)__s + 0x6a8) = *(uint *)((long)__s + 0x6a8) & 0xf000f000 | 0x8000a;
  *(uint *)((long)__s + 0x6ac) = *(uint *)((long)__s + 0x6ac) & 0xf000f000 | 0x19000f;
  *(uint *)((long)__s + 0x6b0) = *(uint *)((long)__s + 0x6b0) & 0xf000f000 | 0x280019;
  *(uint *)((long)__s + 0x6b4) = *(uint *)((long)__s + 0x6b4) & 0xf000f000 | 0x280019;
  *(ulong *)((long)__s + 0x6b8) =
       *(ulong *)((long)__s + 0x6b8) & 0xf000f000f000f000 | u_FdFd_0029f250._0_8_;
  *(undefined4 *)((long)__s + 0x6c0) = 0x10101014;
  *(ulong *)((long)__s + 0x6c4) =
       *(ulong *)((long)__s + 0x6c4) & 0xff000000ff000000 | (ulong)DAT_0029f260;
  *(uint *)((long)__s + 0x6cc) = (uint)*(byte *)((long)__s + 0x6cf) << 0x18 | 0x101010;
  if ((hal_h264e_debug & 2) == 0) {
    uVar36 = auVar51._8_4_;
    uVar15 = auVar51._12_4_;
    uVar14 = auVar52._0_4_;
    uVar40 = auVar52._4_4_;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rdo_cfg");
    uVar36 = (uint)*(byte *)((long)__s + 0x673) << 0x18;
    uVar15 = (uint)*(byte *)((long)__s + 0x677) << 0x18;
    uVar14 = (uint)*(byte *)((long)__s + 0x67b) << 0x18;
    uVar40 = (uint)*(byte *)((long)__s + 0x67f) << 0x18;
  }
  bVar1 = (byte)h264_mode_bias[*(int *)(lVar2 + 0x2a4)];
  uVar30 = 0x18;
  if (0x18 < bVar1) {
    uVar30 = (uint)bVar1;
  }
  uVar32 = (uint)bVar1;
  uVar31 = 0x16;
  if (0x16 < uVar32) {
    uVar31 = uVar32;
  }
  uVar44 = 0x15;
  if (0x15 < uVar32) {
    uVar44 = uVar32;
  }
  *(uint *)((long)__s + 0x670) = uVar44 << 0x10 | uVar31 << 8 | uVar30 | uVar36;
  uVar30 = (uint)bVar1;
  uVar36 = 0x14;
  if (0x14 < uVar30) {
    uVar36 = uVar30;
  }
  uVar32 = 0x13;
  if (0x13 < uVar30) {
    uVar32 = uVar30;
  }
  uVar45 = 0x12;
  if (0x12 < uVar30) {
    uVar45 = uVar30;
  }
  *(uint *)((long)__s + 0x674) = uVar36 << 0x10 | uVar31 | uVar44 << 8 | uVar15;
  *(uint *)((long)__s + 0x678) = uVar45 << 0x10 | uVar36 | uVar32 << 8 | uVar14;
  *(uint *)((long)__s + 0x67c) = uVar30 << 0x10 | uVar30 | (uint)bVar1 << 8 | uVar40;
  if (*(int *)(lVar2 + 0x2c0) != 0) {
    uVar15 = *(uint *)(lVar2 + 0x2c8);
    uVar40 = 10;
    if ((int)*(uint *)(lVar2 + 0x2c4) < 10) {
      uVar40 = *(uint *)(lVar2 + 0x2c4) & 0xfff;
    }
    uVar30 = uVar15 & 0xff;
    uVar14 = *(uint *)((long)__s + 0x6a8);
    *(uint *)((long)__s + 0x6a8) = uVar14 & 0xfffff000 | uVar40;
    uVar36 = 0x80000;
    if ((int)*(uint *)(lVar2 + 0x2c4) < 8) {
      uVar36 = (*(uint *)(lVar2 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x6a8) = uVar14 & 0xf000f000 | uVar40 | uVar36;
    uVar40 = *(uint *)(lVar2 + 0x2c4) & 0xfff;
    if (0xe < (int)*(uint *)(lVar2 + 0x2c4)) {
      uVar40 = 0xf;
    }
    uVar14 = *(uint *)((long)__s + 0x6ac);
    *(uint *)((long)__s + 0x6ac) = uVar14 & 0xfffff000 | uVar40;
    uVar36 = 0x14;
    if (0x14 < uVar30) {
      uVar36 = uVar30;
    }
    *(uint *)((long)__s + 0x6ac) =
         uVar14 & 0xf000f000 | uVar40 | (*(uint *)(lVar2 + 0x2c4) & 0xfff) << 0x10;
    uVar40 = uVar30 << 8;
    uVar14 = uVar30 << 0x10;
    *(uint *)((long)__s + 0x6c0) = uVar15 << 0x18 | uVar36 | uVar40 | uVar14;
    *(uint *)((long)__s + 0x6c4) =
         (uint)*(byte *)((long)__s + 0x6c7) << 0x18 | uVar40 | uVar14 | uVar30;
    *(uint *)((long)__s + 0x6c8) =
         (uint)*(byte *)((long)__s + 0x6cb) << 0x18 | uVar40 | uVar14 | uVar30;
    *(uint *)((long)__s + 0x6cc) =
         (uint)*(byte *)((long)__s + 0x6cf) << 0x18 | uVar40 | uVar14 | uVar30;
  }
  memcpy((void *)((long)__s + 0x774),vepu580_540_h264_flat_scl_tab,0x900);
  lVar35 = *(long *)((long)hal + 0x1e8);
  lVar34 = *hal;
  iVar33 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  uVar15 = (pEVar5->info).bit_target;
  uVar40 = (pEVar5->info).quality_target;
  uVar14 = (pEVar5->info).quality_min;
  uVar36 = (pEVar5->info).quality_max;
  uVar30 = (int)(uVar15 << 4) / (*(int *)(*(long *)((long)hal + 0x60) + 0x40) * iVar33);
  if ((hal_h264e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","bittarget %d qp [%d %d %d]\n","setup_vepu580_rc_base",
               (ulong)uVar15,(ulong)uVar14,uVar40,uVar36);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rc_base");
  }
  uVar14 = uVar14 & 0x3f;
  uVar36 = uVar36 & 0x3f;
  *(uint *)((long)__s + 0x208) =
       *(uint *)((long)__s + 0x208) & 0xc0000000 | uVar14 | uVar14 << 0xc | uVar14 << 0x18 |
       uVar36 << 6 | uVar36 << 0x12;
  *(uint *)((long)__s + 0x20c) =
       uVar36 << 0x18 |
       uVar14 << 0x12 | uVar36 << 0xc | uVar14 << 6 | *(uint *)((long)__s + 0x20c) & 0xc0000000 |
       uVar36;
  *(uint *)((long)__s + 0x210) =
       *(uint *)((long)__s + 0x210) & 0xc0000000 | uVar14 | uVar14 << 0xc | uVar14 << 0x18 |
       uVar36 << 6 | uVar36 << 0x12;
  *(uint *)((long)__s + 0x214) = (*(uint *)((long)__s + 0x214) & 0x3fffffc0) + uVar36 + 0x40000000;
  if (*(int *)(lVar34 + 0x94) == 2) {
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffffc0ff | (uVar40 & 0x3f) << 8;
    *(uint *)((long)__s + 0x134) =
         uVar40 << 0x1a | *(uint *)((long)__s + 0x134) & 0xfffff | (uVar40 & 0x3f) << 0x14;
  }
  else {
    uVar15 = 0x50000;
    if ((int)uVar30 < 0x100000) {
      uVar15 = uVar30;
    }
    iVar20 = (((int)(uVar15 * iVar33) >> 4) * 5) / 0x10;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffffc0ff | (uVar40 & 0x3f) << 8;
    *(uint *)((long)__s + 0x130) = (*(uint *)((long)__s + 0x130) & 0xff8) + iVar33 * 0x1000 + 3;
    uVar12 = *(ushort *)((long)__s + 0x134);
    *(uint *)((long)__s + 0x134) =
         uVar14 << 0x1a |
         uVar36 << 0x14 |
         (*(uint *)(lVar34 + 0x17c + (ulong)(*(int *)(lVar35 + 0x2c) == 2) * 4) & 0xf) << 0x10 |
         (uint)uVar12;
    *(uint *)((long)__s + 0x138) = *(uint *)((long)__s + 0x138) & 0xfff00000 | uVar15 & 0xfffff;
    *(ulong *)((long)__s + 0x1d8) =
         *(ulong *)((long)__s + 0x1d8) & 0xfff00000fe000000 | (ulong)DAT_0029f280;
    *(int *)((long)__s + 0x1e0) = iVar20 * -4;
    *(int *)((long)__s + 0x1e4) = -iVar20;
    *(int *)((long)__s + 0x1e8) = iVar20;
    *(int *)((long)__s + 0x1ec) = iVar20 << 2;
    *(undefined8 *)((long)__s + 0x1f0) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x1f8) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x200) = 0x7fffffff;
    *(ulong *)((long)__s + 0x248) =
         *(ulong *)((long)__s + 0x248) & DAT_0029f200 | (ulong)DAT_0029f290;
    if (*(int *)(lVar34 + 0x94) == 4) {
      *(uint *)((long)__s + 0x134) = uVar14 << 0x1a | uVar36 << 0x14 | (uint)uVar12;
    }
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rc_base");
    }
  }
  cfgs = *(MppDevRegOffCfgs **)((long)hal + 0x38);
  s = task->packet;
  frame = task->frame;
  pvVar24 = mpp_frame_get_buffer(frame);
  pvVar42 = task->output;
  MVar18 = mpp_frame_get_fmt(frame);
  RVar16 = mpp_frame_get_hor_stride(frame);
  RVar19 = mpp_frame_get_ver_stride(frame);
  iVar33 = mpp_buffer_get_fd_with_caller(pvVar24,"setup_vepu580_io_buf");
  sVar25 = mpp_packet_get_length(s);
  sVar26 = mpp_buffer_get_size_with_caller(pvVar42,"setup_vepu580_io_buf");
  iVar20 = mpp_buffer_get_fd_with_caller(pvVar42,"setup_vepu580_io_buf");
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_io_buf");
  }
  *(int *)((long)__s + 0x60) = iVar33;
  *(int *)((long)__s + 100) = iVar33;
  *(int *)((long)__s + 0x68) = iVar33;
  *(int *)((long)__s + 0x90) = iVar20;
  *(int *)((long)__s + 0x94) = iVar20;
  *(int *)((long)__s + 0x98) = iVar20;
  *(int *)((long)__s + 0x9c) = iVar20;
  if ((MVar18 & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(frame);
    offset_00 = 0;
    goto switchD_002154aa_caseD_8;
  }
  offset_00 = 0;
  offset = 0;
  if (MPP_FMT_AYUV1BPP < (MVar18 & 0xfffc) || (MVar18 & 0xf0000) != MPP_FMT_YUV420SP)
  goto switchD_002154aa_caseD_8;
  vepu541_set_fmt((VepuFmtCfg *)&rplmo,MVar18);
  offset_00 = 0;
  offset = 0;
  switch(rplmo.modification_of_pic_nums_idc) {
  case 4:
  case 6:
  case 0xc:
    offset_00 = RVar19 * RVar16;
    goto LAB_002154c9;
  case 5:
    iVar20 = RVar19 * RVar16 * 3;
    iVar33 = 2;
    goto LAB_002154f1;
  case 7:
    iVar20 = RVar19 * RVar16 * 5;
    iVar33 = 4;
LAB_002154f1:
    offset = RVar19 * RVar16;
    offset_00 = iVar20 / iVar33;
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
    break;
  case 0xd:
    offset_00 = RVar19 * RVar16 * 2;
LAB_002154c9:
    offset = RVar19 * RVar16;
    break;
  default:
    offset = 0;
  }
switchD_002154aa_caseD_8:
  mpp_dev_multi_offset_update(cfgs,0xa1,offset);
  mpp_dev_multi_offset_update(cfgs,0xa2,offset_00);
  mpp_dev_multi_offset_update(cfgs,0xac,(RK_U32)sVar26);
  mpp_dev_multi_offset_update(cfgs,0xaf,(RK_U32)sVar25);
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_io_buf"), (hal_h264e_debug & 2) != 0
     )) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_roi");
  }
  puVar6 = *(undefined8 **)((long)hal + 0x118);
  if (puVar6 != (undefined8 *)0x0) {
    uVar15 = ((int)((ulong)*(undefined8 *)(*hal + 0xc) >> 0x20) + 0x3f >> 4 & 0xfffffffcU) *
             ((int)*(undefined8 *)(*hal + 0xc) + 0x3f >> 4 & 0xfffffffcU);
    sVar25 = mpp_buffer_get_size_with_caller((MppBuffer)*puVar6,"setup_vepu580_roi");
    if (sVar25 < uVar15 * 8) {
      _mpp_log_l(2,"hal_h264e_vepu580","roi base cfg buf not enough, roi is invalid",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      iVar33 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar6,"setup_vepu580_roi");
      *(int *)((long)__s + 0xa8) = iVar33;
    }
    if ((*(byte *)(puVar6 + 4) & 1) != 0) {
      sVar25 = mpp_buffer_get_size_with_caller((MppBuffer)puVar6[1],"setup_vepu580_roi");
      if (sVar25 < uVar15 * 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi qp cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar33 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar6[1],"setup_vepu580_roi");
        *(int *)((long)__s + 0xac) = iVar33;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 1;
      }
    }
    if ((*(byte *)(puVar6 + 4) & 2) != 0) {
      sVar25 = mpp_buffer_get_size_with_caller((MppBuffer)puVar6[2],"setup_vepu580_roi");
      if (sVar25 < uVar15 >> 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi amv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar33 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar6[2],"setup_vepu580_roi");
        *(int *)((long)__s + 0xb0) = iVar33;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 2;
      }
    }
    if ((*(byte *)(puVar6 + 4) & 4) != 0) {
      sVar25 = mpp_buffer_get_size_with_caller((MppBuffer)puVar6[3],"setup_vepu580_roi");
      if (sVar25 < uVar15 * 0x60 >> 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi mv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar33 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar6[3],"setup_vepu580_roi");
        *(int *)((long)__s + 0xb4) = iVar33;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 4;
      }
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_roi");
  }
  lVar35 = *(long *)((long)hal + 0x78);
  bufs = *(HalBufs *)((long)hal + 0x18);
  RVar16 = *(RK_U32 *)((long)hal + 0x20);
  pHVar27 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar35 + 4));
  pHVar28 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar35 + 8));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_recn_refr");
  }
  if ((pHVar27 != (HalBuf *)0x0) && (pHVar27->cnt != 0)) {
    pvVar42 = *pHVar27->buf;
    pvVar24 = pHVar27->buf[1];
    iVar33 = mpp_buffer_get_fd_with_caller(pvVar42,"setup_vepu580_recn_refr");
    if (((pvVar42 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu580_recn_refr",0x66c), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar24 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu580_recn_refr",0x66d), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00216ff9;
    *(int *)((long)__s + 0x6c) = iVar33;
    *(int *)((long)__s + 0x70) = iVar33;
    iVar33 = mpp_buffer_get_fd_with_caller(pvVar24,"setup_vepu580_recn_refr");
    *(int *)((long)__s + 0x84) = iVar33;
  }
  if ((pHVar28 != (HalBuf *)0x0) && (pHVar28->cnt != 0)) {
    pvVar42 = *pHVar28->buf;
    pvVar24 = pHVar28->buf[1];
    iVar33 = mpp_buffer_get_fd_with_caller(pvVar42,"setup_vepu580_recn_refr");
    if (((pvVar42 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu580_recn_refr",0x679), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar24 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu580_recn_refr",0x67a), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00216ff9;
    *(int *)((long)__s + 0x74) = iVar33;
    *(int *)((long)__s + 0x78) = iVar33;
    iVar33 = mpp_buffer_get_fd_with_caller(pvVar24,"setup_vepu580_recn_refr");
    *(int *)((long)__s + 0x88) = iVar33;
  }
  mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa4,RVar16);
  mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa6,RVar16);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_recn_refr");
  }
  if (task->md_info == (MppBuffer)0x0) {
    uVar15 = 0;
    iVar33 = 0;
  }
  else {
    iVar33 = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu580_gen_regs");
    uVar15 = (uint)(task->md_info != (MppBuffer)0x0) << 3;
  }
  *(int *)((long)__s + 0x8c) = iVar33;
  *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xfffffff7 | uVar15;
  RVar16 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)__s + 0x110) =
       *(uint *)((long)__s + 0x110) & 0xc000ffff | (RVar16 & 0x3fff) << 0x10;
  RVar16 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xffffc000 | RVar16 & 0x3fff;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_split");
  }
  iVar33 = *(int *)(lVar2 + 0xe94);
  if (iVar33 == 2) {
    iVar33 = *(int *)(lVar2 + 0xc);
    iVar20 = *(int *)(lVar2 + 0x10);
    uVar15 = *(uint *)(lVar2 + 0xe98);
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x148) =
         *(uint *)((long)__s + 0x148) & 0xfff00000 | *(int *)(lVar2 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    iVar48 = *(int *)(lVar2 + 0xe9c);
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xbfffffff | (uint)(iVar48 != 0) << 0x1e;
    if (((*(byte *)(lVar2 + 0xe9c) & 1) != 0) ||
       ((iVar48 != 0 && (0x20 < (((iVar20 + 0xf >> 4) * (iVar33 + 0xf >> 4) + uVar15) - 1) / uVar15)
        ))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar33 == 1) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) =
         *(uint *)((long)__s + 0x144) & 0xfff00000 | *(uint *)(lVar2 + 0xe98) & 0xfffff;
    uVar15 = (uint)(*(int *)(lVar2 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xbfffffff | uVar15;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar15 >> 0x1b;
  }
  else if (iVar33 == 0) {
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(ulong *)((long)__s + 0x140) = *(ulong *)((long)__s + 0x140) & 0xfff0000080007ff8;
    *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","invalide slice split mode %d\n","setup_vepu580_split");
  }
  *(undefined4 *)(lVar2 + 0xe90) = 0;
  if ((hal_h264e_debug & 2) == 0) {
    iVar33 = piVar3[7];
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_split");
    iVar33 = piVar3[7];
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_me");
    }
  }
  if ((iVar33 - 0xbU < 3) || ((uVar15 = 0xc, iVar33 != 10 && (iVar33 != 99)))) {
    uVar15 = 0x1c;
  }
  iVar33 = piVar3[0xf] * 2 + 1;
  uVar40 = 0x2f0b;
  if (iVar33 < 0x2c) {
    uVar40 = iVar33 / 4 & 0xfU | 0x2f00;
  }
  uVar36 = uVar15 >> 2;
  iVar33 = (int)((long)((long)(piVar3[0x10] * 0x10 + 0x3f) & 0xffffffffffffffc0U) / 0x80);
  uVar14 = iVar33 << 4;
  if (uVar36 == iVar33 * 4 || SBORROW4(uVar36,iVar33 * 4) != (int)(uVar36 + iVar33 * -4) < 0) {
    uVar14 = uVar15;
  }
  uVar14 = uVar14 & 0x3c;
  *(uint *)((long)__s + 0x150) = uVar14 * 4 | *(uint *)((long)__s + 0x150) & 0xc000 | uVar40;
  uVar15 = (uint)*(ushort *)((long)__s + 0x156) * 0x10000;
  uVar36 = uVar15 + 0x505;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar36 = uVar15;
  }
  *(uint *)((long)__s + 0x154) = uVar36;
  iVar33 = 0x20000;
  if (piVar3[7] < 0x15) {
    iVar33 = (uint)(10 < piVar3[7]) << 0x10;
  }
  *(uint *)((long)__s + 0x154) = iVar33 + (uVar36 & 0x46300505) + 0x80000;
  uVar15 = *(uint *)((long)__s + 0x160);
  uVar30 = uVar40 & 0xf;
  uVar31 = (uVar15 & 0x1fff) + uVar30 * -4;
  uVar36 = uVar31 >> 4;
  if ((int)uVar31 < 0) {
    uVar36 = -(0xf - uVar31 >> 4);
  }
  uVar32 = (piVar3[0xf] * 0x10 + 0x3f >> 6) - 1;
  uVar31 = uVar32;
  if ((int)uVar36 < (int)uVar32) {
    uVar31 = uVar36;
  }
  uVar44 = 0;
  if ((int)uVar36 < 0) {
    uVar31 = uVar44;
  }
  if ((int)(((uVar15 & 0x1fff) + uVar30 * 4 + 0xf >> 4) + uVar32) < 0) {
    uVar32 = uVar44;
  }
  uVar36 = (uVar32 - uVar31) * 0x40 + 0x40;
  uVar37 = 0x40000;
  if (uVar36 != 0) {
    uVar37 = (ulong)((uVar36 & 0x7fc0) << 0xc);
  }
  uVar40 = (uVar15 & 0xf) + (uVar40 & 3) * -4;
  uVar31 = (uVar40 >> 0x1b & 0xfffffff0) + uVar40 + uVar30 * 8 + 0xf >> 4;
  uVar30 = uVar15 >> 0x10 & 3;
  uVar36 = uVar30 + uVar14 * 2 + 3 >> 2;
  uVar15 = (uint)(uVar37 >> 0x12);
  uVar40 = uVar31 + 1;
  if (uVar15 <= uVar31) {
    uVar40 = uVar15;
  }
  uVar31 = uVar36 + 1;
  iVar33 = (int)(uVar37 >> 0x10);
  uVar45 = 1;
  uVar32 = uVar31;
  for (; (uVar21 = uVar31, uVar45 - uVar36 != 1 &&
         (uVar21 = uVar45, uVar40 * 4 * uVar32 + uVar44 < 0x9a0)); uVar44 = uVar44 + iVar33) {
    uVar45 = uVar45 + 1;
    bVar49 = uVar32 < 3;
    uVar32 = uVar32 - 1;
    if (bVar49) {
      uVar32 = 1;
    }
  }
  iVar20 = uVar32 << 2;
  bVar49 = uVar30 + uVar14 * 2 == 0;
  uVar14 = (uint)bVar49;
  uVar36 = (uVar21 - 1) + uVar14;
  if (bVar49) {
    iVar20 = 0;
  }
  uVar14 = uVar21 + uVar14;
  if (0x9a0 < iVar20 * uVar40 + iVar33 * uVar36) {
    uVar14 = uVar36;
  }
  *(uint *)((long)__s + 0x158) =
       (uVar14 - 1) * uVar15 + uVar40 & 0x7ff |
       (uVar14 & 0x1f) << 0xb | *(uint *)((long)__s + 0x158) & 0xf8030000 | (uint)uVar37;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_me");
  }
  if (((pEVar5->frm).val >> 0x26 & 1) != 0) {
    lVar34 = (long)((pEVar5->frm).val >> 0x30) % (long)*(int *)(lVar2 + 0xc4);
    iVar39 = (int)lVar34;
    lVar35 = *hal;
    iVar33 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
    iVar20 = *(int *)(*(long *)((long)hal + 0x60) + 0x40);
    iVar48 = *(int *)(lVar35 + 0x16c);
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_intra_refresh");
      lVar35 = *hal;
    }
    if (*(int *)(lVar35 + 0x164) == 0) {
      uVar37 = 0xfffffffffffffffa;
    }
    else {
      iVar47 = (iVar20 + 3U & 0x3ffffffc) * (iVar33 + 3U & 0xfffffffc);
      iVar22 = iVar47 * 8;
      if (SBORROW4(*(int *)((long)hal + 0x130),iVar22) !=
          *(int *)((long)hal + 0x130) + iVar47 * -8 < 0) {
        if (*(long *)((long)hal + 0x120) == 0) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)((long)hal + 0x120),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_h264e_vepu580","setup_vepu580_intra_refresh");
        }
        if (*(MppBuffer *)((long)hal + 0x128) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller
                    (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
        }
        mpp_buffer_get_with_tag
                  (*(MppBufferGroup *)((long)hal + 0x120),(MppBuffer *)((long)hal + 0x128),
                   (long)iVar22,"hal_h264e_vepu580","setup_vepu580_intra_refresh");
        *(int *)((long)hal + 0x130) = iVar22;
      }
      pvVar42 = *(MppBuffer *)((long)hal + 0x128);
      if (pvVar42 == (MppBuffer)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->roi_base_cfg_buf","setup_vepu580_intra_refresh",0x5ea);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00216ff9;
        pvVar42 = *(MppBuffer *)((long)hal + 0x128);
      }
      iVar33 = iVar33 << 4;
      iVar20 = iVar20 << 4;
      iVar22 = mpp_buffer_get_fd_with_caller(pvVar42,"setup_vepu580_intra_refresh");
      pvVar29 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
      for (lVar35 = 0; iVar47 != (int)lVar35; lVar35 = lVar35 + 1) {
        *(undefined8 *)((long)pvVar29 + lVar35 * 8) = 0x4000000000000000;
      }
      ptr = (ushort *)mpp_osal_calloc("setup_vepu580_intra_refresh",0x10);
      uVar15 = 0;
      if (ptr == (ushort *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","Failed to calloc for MppEncROIRegion !\n",
                   "setup_vepu580_intra_refresh");
        uVar15 = 0xfffffffc;
      }
      lVar35 = *hal;
      sVar10 = (short)iVar48;
      sVar46 = (short)lVar34;
      if (*(int *)(lVar35 + 0x168) == 1) {
        ptr[1] = 0;
        ptr[3] = (ushort)iVar20;
        if (iVar39 == 0) {
          sVar46 = (short)(iVar48 << 4);
          uVar12 = 0;
        }
        else {
          uVar12 = sVar46 * sVar10 * 0x10 - 0x20;
          sVar46 = sVar10 * 0x10 + 0x20;
        }
        *ptr = uVar12;
        uVar40 = 1;
        uVar14 = 0xfffffff0;
        lStackY_d0 = 4;
LAB_002161d9:
        *(short *)((long)ptr + lStackY_d0) = sVar46;
        *(uint *)((long)__s + 0x150) = uVar14 & *(uint *)((long)__s + 0x150) | uVar40;
        lVar35 = *hal;
      }
      else if (*(int *)(lVar35 + 0x168) == 0) {
        *ptr = 0;
        ptr[2] = (ushort)iVar33;
        if (iVar39 == 0) {
          sVar46 = (short)(iVar48 << 4);
          uVar12 = 0;
        }
        else {
          uVar12 = sVar46 * sVar10 * 0x10 - 0x20;
          sVar46 = sVar10 * 0x10 + 0x20;
        }
        ptr[1] = uVar12;
        uVar40 = 0x10;
        uVar14 = 0xffffff0f;
        lStackY_d0 = 6;
        goto LAB_002161d9;
      }
      ptr[4] = 1;
      ptr[5] = -*(short *)(lVar35 + 0x124);
      ptr[6] = 1;
      ptr[7] = 1;
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      *(int *)((long)__s + 0xa8) = iVar22;
      if (pvVar29 == (void *)0x0 || ptr == (ushort *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","invalid buf %p roi %p\n","vepu580_h264_set_one_roi",
                   pvVar29,ptr);
      }
      else {
        iVar33 = iVar33 >> 4;
        iVar20 = iVar20 >> 4;
        uVar40 = (uint)(*ptr >> 4);
        uVar14 = (uint)(ptr[1] >> 4);
        iVar39 = (ptr[2] + 0xf >> 4) + uVar40;
        iVar48 = (ptr[3] + 0xf >> 4) + uVar14;
        if (iVar33 <= iVar39) {
          iVar39 = iVar33;
        }
        if (iVar20 <= iVar48) {
          iVar48 = iVar20;
        }
        if (*ptr < 0x10) {
          uVar40 = 0;
        }
        if (ptr[1] < 0x10) {
          uVar14 = 0;
        }
        iVar20 = iVar39 - uVar40;
        if (((iVar20 == 0 || iVar39 < (int)uVar40) &&
            (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                        "pos_x_end > pos_x_init","vepu580_h264_set_one_roi",0x5b7),
            (mpp_debug._3_1_ & 0x10) != 0)) ||
           ((iVar39 = iVar48 - uVar14, iVar39 == 0 || iVar48 < (int)uVar14 &&
            (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                        "pos_y_end > pos_y_init","vepu580_h264_set_one_roi",0x5b8),
            (mpp_debug._3_1_ & 0x10) != 0)))) {
LAB_00216ff9:
          abort();
        }
        uVar36 = iVar33 + 3U & 0xfffffffc;
        iVar33 = 0;
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        pvVar29 = (void *)((long)pvVar29 + (long)(int)(uVar14 * uVar36 + uVar40) * 8);
        if (iVar39 < 1) {
          iVar39 = 0;
        }
        for (; iVar33 != iVar39; iVar33 = iVar33 + 1) {
          for (lVar35 = 0; iVar20 * 8 != (int)lVar35; lVar35 = lVar35 + 8) {
            *(undefined8 *)((long)pvVar29 + lVar35) = 0x2000000000000000;
          }
          pvVar29 = (void *)((long)pvVar29 + (long)(int)uVar36 * 8);
        }
      }
      mpp_osal_free("setup_vepu580_intra_refresh",ptr);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x128),0,"setup_vepu580_intra_refresh");
      uVar37 = (ulong)uVar15;
    }
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave, ret %d\n","setup_vepu580_intra_refresh",uVar37);
    }
  }
  if ((((*(int *)(lVar2 + 0x1868) == 0) || ((pEVar5->info).complex_scene != 0)) ||
      (*(int *)(lVar2 + 0x94) != 4)) || (*(int *)(lVar2 + 0x1864) != 1)) goto LAB_00216621;
  lVar35 = *hal;
  iVar33 = (*(int *)(lVar35 + 0x10) + 0xf >> 4) * (*(int *)(lVar35 + 0xc) + 0x3f >> 4 & 0xfffffffcU)
  ;
  *(int *)((long)hal + 0x188) = iVar33 * 8;
  *(int *)((long)hal + 0x18c) = iVar33 * 2;
  *(int *)((long)hal + 400) = iVar33;
  if (*(int *)(lVar35 + 0x1868) == 0) {
    uVar15 = 0;
    _mpp_log_l(4,"hal_h264e_vepu580","deblurring is closed!\n",(char *)0x0);
    bVar49 = true;
  }
  else {
    if ((*(long *)((long)hal + 0x170) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x170),(long)(iVar33 * 8),
                   "hal_h264e_vepu580","setup_vepu580_qpmap_buf"),
       *(MppBuffer *)((long)hal + 0x170) == (MppBuffer)0x0)) {
      fmt = "qpmap_base_cfg_buf malloc fail, qpmap invalid\n";
    }
    else {
      if ((*(long *)((long)hal + 0x178) != 0) ||
         (mpp_buffer_get_with_tag
                    ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x178),(long)(iVar33 * 2),
                     "hal_h264e_vepu580","setup_vepu580_qpmap_buf"),
         *(MppBuffer *)((long)hal + 0x178) != (MppBuffer)0x0)) {
        uVar15 = 0;
        bVar49 = true;
        if (*(long *)((long)hal + 0x180) == 0) {
          pvVar29 = mpp_osal_malloc("setup_vepu580_qpmap_buf",(long)iVar33);
          *(void **)((long)hal + 0x180) = pvVar29;
          uVar15 = 0;
          bVar49 = true;
          if (pvVar29 == (void *)0x0) {
            bVar49 = false;
            _mpp_log_l(2,"hal_h264e_vepu580","md_flag_buf malloc fail, qpmap invalid\n",(char *)0x0)
            ;
            uVar15 = 0xfffffffa;
          }
        }
        goto LAB_002165cd;
      }
      fmt = "qpmap_qp_cfg_buf malloc fail, qpmap invalid\n";
    }
    bVar49 = false;
    _mpp_log_l(2,"hal_h264e_vepu580",fmt,(char *)0x0);
    uVar15 = 0xfffffffa;
  }
LAB_002165cd:
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave, ret %d\n","setup_vepu580_qpmap_buf",(ulong)uVar15);
  }
  if (!bVar49) {
    _mpp_log_l(2,"hal_h264e_vepu580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
LAB_00216621:
  vepu580_set_osd((Vepu541OsdCfg *)((long)hal + 0x138));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_l2");
  }
  memcpy((void *)((long)__s + 0x4bc),h264e_lambda_default + 6,0xd0);
  memset((void *)((long)__s + 0x3bc),0,0xd0);
  *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xff00fffe | 0x190000;
  *(uint *)((long)__s + 700) = *(uint *)((long)__s + 700) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2c0) = *(uint *)((long)__s + 0x2c0) & 0xf000f000 | 0x240009;
  *(uint *)((long)__s + 0x2c4) = *(uint *)((long)__s + 0x2c4) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2c8) = *(uint *)((long)__s + 0x2c8) & 0xf000f000 | 0x240009;
  *(ulong *)((long)__s + 0x2cc) =
       *(ulong *)((long)__s + 0x2cc) & 0xf000f000f000f000 | (ulong)DAT_0029f2c0;
  *(uint *)((long)__s + 0x2d4) = *(uint *)((long)__s + 0x2d4) & 0xfffff000;
  *(undefined8 *)((long)__s + 0x2d8) = 0x30283c3030283c30;
  *(undefined8 *)((long)__s + 0x2e0) = 0x201c2a2430283c30;
  uVar15 = *(uint *)((long)__s + 0x2ec);
  *(uint *)((long)__s + 0x2ec) = uVar15 & 0xfff003ff | 0x2ac00;
  bVar49 = *(int *)(lVar4 + 0x2c) == 2;
  uVar40 = 0x247;
  if (bVar49) {
    uVar40 = 0x2ab;
  }
  *(uint *)((long)__s + 0x2ec) = uVar15 & 0xfff00000 | 0x2ac00 | uVar40;
  uVar15 = (uint)bVar49;
  uVar37 = CONCAT44((int)(uVar15 << 0x1f) >> 0x1f,(int)(uVar15 << 0x1f) >> 0x1f);
  *(ulong *)((long)__s + 0x2fc) =
       uVar37 & (ulong)DAT_0029f2f0 | ~uVar37 & 0x2d005100100004 |
       *(ulong *)((long)__s + 0x2fc) & (ulong)DAT_0029f2d0;
  bVar49 = *(int *)(lVar4 + 0x2c) == 2;
  uVar15 = 0x101419;
  if (bVar49) {
    uVar15 = 0x101214;
  }
  uVar40 = (uint)bVar49;
  uVar37 = CONCAT44((int)(uVar40 << 0x1f) >> 0x1f,(int)(uVar40 << 0x1f) >> 0x1f);
  *(ulong *)((long)__s + 0x30c) =
       *(ulong *)((long)__s + 0x30c) & DAT_0029f200 |
       uVar37 & (ulong)DAT_0029f310 | ~uVar37 & (ulong)DAT_0029f300;
  *(uint *)((long)__s + 0x314) = (uint)*(byte *)((long)__s + 0x317) << 0x18 | uVar15;
  *(uint *)((long)__s + 0x31c) = *(uint *)((long)__s + 0x31c) & 0xfffffcf8 | 0x306;
  *(uint *)((long)__s + 800) = *(uint *)((long)__s + 800) & 0xe0080200 | 0x8014020;
  *(uint *)((long)__s + 0x324) = *(uint *)((long)__s + 0x324) & 0xfc00fc00 | 0x80004;
  *(uint *)((long)__s + 0x328) = *(uint *)((long)__s + 0x328) & 0xfc00fc00 | 0x180018;
  *(ulong *)((long)__s + 0x32c) =
       *(ulong *)((long)__s + 0x32c) & 0xc0000000f0f0f000 | 0x800800408030032;
  *(ulong *)((long)__s + 0x334) =
       *(ulong *)((long)__s + 0x334) & 0xfff0fffffffff000 | 0x1000000000002;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 1) {
      *(undefined1 *)((long)__s + lVar35 + 0x21c) = *(undefined1 *)(lVar2 + 0x198 + lVar35 * 4);
      *(byte *)((long)__s + lVar35 + 0x22c) = *(byte *)(lVar2 + 0x218 + lVar35 * 4) & 0x3f;
    }
  }
  else {
    for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 1) {
      *(undefined1 *)((long)__s + lVar35 + 0x21c) = *(undefined1 *)(lVar2 + 0x1d8 + lVar35 * 4);
      *(byte *)((long)__s + lVar35 + 0x22c) = *(byte *)(lVar2 + 600 + lVar35 * 4) & 0x3f;
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_l2");
  }
  if (*(MppBuffer *)((long)hal + 0x1f0) == (MppBuffer)0x0) {
    *(undefined4 *)((long)__s + 0xbc) = 0;
  }
  else {
    iVar33 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x1f0),"setup_vepu580_ext_line_buf");
    RVar16 = *(RK_U32 *)((long)hal + 0x58);
    *(int *)((long)__s + 0xb8) = iVar33;
    *(int *)((long)__s + 0xbc) = iVar33;
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xb6,RVar16);
    if (disable_rcb_buf == 0) {
      rplmo.abs_diff_pic_num_minus1 = RVar16;
      rplmo.modification_of_pic_nums_idc = 0xb7;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),8,&rplmo);
      rplmo.modification_of_pic_nums_idc = 0xb6;
      rplmo.abs_diff_pic_num_minus1 = 0;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),8,&rplmo);
    }
  }
  plVar7 = *(long **)((long)hal + 0x168);
  if (plVar7 != (long *)0x0) {
    plVar8 = (long *)*plVar7;
    lVar2 = *plVar8;
    lVar35 = plVar8[0x3a];
    bVar49 = *(int *)(lVar2 + 0x1864) != 1;
    lVar4 = plVar8[0x3d];
    *(uint *)((long)plVar7 + 0xc) = (uint)bVar49;
    uVar15 = (int)plVar7[1] + (uint)bVar49 * 2;
    if (uVar15 < 4) {
      if (*(int *)(lVar4 + 0x2c) != 2) {
        if ((int)plVar7[1] == 0) {
          pRVar41 = h264e_klut_weight + 4;
          if (*(int *)(lVar2 + 0x94) == 4) {
            pRVar41 = h264e_klut_weight;
          }
        }
        else {
          pRVar41 = h264e_klut_weight;
        }
        pRVar43 = (RK_U32 *)(lVar35 + 0x25c);
        for (lVar34 = 0x18; lVar34 != 0; lVar34 = lVar34 + -1) {
          *pRVar43 = *pRVar41;
          pRVar41 = pRVar41 + (ulong)bVar50 * -2 + 1;
          pRVar43 = pRVar43 + (ulong)bVar50 * -2 + 1;
        }
      }
      *(ulong *)(lVar35 + 0x248) =
           *(ulong *)(lVar35 + 0x248) & 0xff000000ff000000 | (ulong)DAT_0029f290;
      if ((int)plVar7[1] != 0) {
        *(uint *)(lVar35 + 0x2d4) = *(uint *)(lVar35 + 0x2d4) & 0xfffff000 | 0x9c5;
        *(uint *)(lVar35 + 0x2ec) = *(uint *)(lVar35 + 0x2ec) & 0xfff003ff | 0x55400;
        *(byte *)(lVar35 + 600) = *(byte *)(lVar35 + 600) & 0xf8;
        *(ulong *)(lVar35 + 0x180) = *(ulong *)(lVar35 + 0x180) & 0xf000f000fff7ffff;
        *(byte *)(lVar35 + 0x58c) = *(byte *)(lVar35 + 0x58c) & 0xfe;
        *(uint *)(lVar35 + 0x300) = *(uint *)(lVar35 + 0x300) & 0xffc0ffff | 0x330000;
        *(byte *)(lVar35 + 0x31c) = *(byte *)(lVar35 + 0x31c) & 0xfb;
        *(uint *)(lVar35 + 0x32c) = *(uint *)(lVar35 + 0x32c) & 0xfffff000;
        *(uint *)(lVar35 + 0x334) = *(uint *)(lVar35 + 0x334) & 0xfffff000;
        *(uint *)(lVar35 + 0x338) = *(uint *)(lVar35 + 0x338) & 0xfff0ffff | 0x80000;
      }
      *(ulong *)(lVar35 + 0x658) =
           *(ulong *)(lVar35 + 0x658) & 0xfffff000f000f000 | (ulong)DAT_0029f370;
      *(ulong *)(lVar35 + 0x670) =
           CONCAT44(intra_atf_wgt[uVar15][5] << 0x10,intra_atf_wgt[uVar15][2] << 0x10) &
           (ulong)DAT_0029f3a0 |
           CONCAT44(intra_atf_wgt[uVar15][4] << 8,intra_atf_wgt[uVar15][1] << 8) &
           (ulong)DAT_0029f390 |
           *(ulong *)(lVar35 + 0x670) & 0xff000000ff000000 |
           CONCAT44(intra_atf_wgt[uVar15][3],intra_atf_wgt[uVar15][0]) & (ulong)DAT_0029f380;
      *(uint *)(lVar35 + 0x678) =
           (intra_atf_wgt[uVar15][8] & 0xffU) << 0x10 |
           (intra_atf_wgt[uVar15][7] & 0xffU) << 8 |
           (uint)*(byte *)(lVar35 + 0x67b) << 0x18 | (uint)(byte)intra_atf_wgt[uVar15][6];
      *(uint *)(lVar35 + 0x67c) = (uint)*(byte *)(lVar35 + 0x67f) << 0x18 | 0x101010;
      *(ulong *)(lVar35 + 0x6a8) =
           *(ulong *)(lVar35 + 0x6a8) & 0xf000f000f000f000 | (ulong)DAT_0029f3b0;
      *(undefined4 *)(lVar35 + 0x6c0) = 0x10101010;
      *(ulong *)(lVar35 + 0x6c4) =
           *(ulong *)(lVar35 + 0x6c4) & 0xff000000ff000000 | (ulong)DAT_0029f260;
      *(uint *)(lVar35 + 0x6cc) = (uint)*(byte *)(lVar35 + 0x6cf) << 0x18 | 0x101010;
      if (*(int *)(lVar4 + 0x2c) != 2) {
        *(ulong *)(lVar35 + 0x30c) =
             CONCAT44(atr_wgt[uVar15][5] << 0x10,atr_wgt[uVar15][2] << 0x10) & (ulong)DAT_0029f3a0 |
             CONCAT44(atr_wgt[uVar15][4] << 8,atr_wgt[uVar15][1] << 8) & (ulong)DAT_0029f390 |
             *(ulong *)(lVar35 + 0x30c) & DAT_0029f200 |
             CONCAT44(atr_wgt[uVar15][3],atr_wgt[uVar15][0]) & (ulong)DAT_0029f380;
        *(uint *)(lVar35 + 0x314) =
             (atr_wgt[uVar15][8] & 0xffU) << 0x10 |
             (atr_wgt[uVar15][7] & 0xffU) << 8 |
             (uint)*(byte *)(lVar35 + 0x317) << 0x18 | (uint)(byte)atr_wgt[uVar15][6];
      }
      *(ulong *)(lVar35 + 0x324) =
           CONCAT44(cime_multi[uVar15][3] << 0x10,4) & 0x3ff0000ffffffff |
           *(ulong *)(lVar35 + 0x324) & (ulong)DAT_0029f3d0 |
           CONCAT44(cime_multi[uVar15][2],cime_multi[uVar15][1] << 0x10) & (ulong)DAT_0029f3c0;
      *(uint *)(lVar35 + 0x330) =
           (rime_multi[uVar15][2] & 0x3ffU) * 0x100000 +
           (*(uint *)(lVar35 + 0x330) & 0xc0000000 | (rime_multi[uVar15][1] & 0x3ffU) << 10) + 4;
      if (*(int *)(lVar2 + 0x18c) != 0) {
        uVar15 = 0x2ab;
        if (*(uint *)(lVar2 + 0x184) != 0) {
          uVar15 = *(uint *)(lVar2 + 0x184) & 0x3ff;
        }
        uVar40 = *(uint *)(lVar35 + 0x2ec);
        *(uint *)(lVar35 + 0x2ec) = uVar40 & 0xfffffc00 | uVar15;
        uVar14 = 0x55400;
        if (*(uint *)(lVar2 + 0x188) != 0) {
          uVar14 = (*(uint *)(lVar2 + 0x188) & 0x3ff) << 10;
        }
        *(uint *)(lVar35 + 0x2ec) = uVar40 & 0xfff00000 | uVar15 | uVar14;
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu580","scene_motion_flag is a wrong value %d\n",
                 "vepu580_h264e_tune_reg_patch");
    }
  }
  if (((ulong)pEVar5->frm & 4) != 0) {
    RVar16 = (*(int *)(*hal + 0x10) + 0xfU & 0x3fffff0) *
             (*(int *)(*hal + 0xc) + 0x3fU & 0xffffffc0);
    if ((*(long *)((long)hal + 0x198) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x198),
                   (long)(int)(((int)RVar16 >> 1) + RVar16),"hal_h264e_vepu580",
                   "vepu580_h264e_save_pass1_patch"),
       *(MppBuffer *)((long)hal + 0x198) == (MppBuffer)0x0)) {
      _mpp_log_l(2,"hal_h264e_vepu580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 4;
      iVar33 = mpp_buffer_get_fd_with_caller
                         (*(MppBuffer *)((long)hal + 0x198),"vepu580_h264e_save_pass1_patch");
      *(int *)((long)__s + 0x6c) = iVar33;
      *(int *)((long)__s + 0x70) = iVar33;
      *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) | 0x80;
      mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa4,RVar16);
      *(byte *)((long)__s + 0x140) = *(byte *)((long)__s + 0x140) & 0xfe;
      *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
    }
  }
  if (((ulong)pEVar5->frm & 8) != 0) {
    uVar15 = *(int *)(*hal + 0xc) + 0x3f;
    RVar16 = (*(int *)(*hal + 0x10) + 0xfU & 0x3fffff0) * (uVar15 & 0xffffffc0);
    iVar33 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x198),"vepu580_h264e_use_pass1_patch");
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","vepu580_h264e_use_pass1_patch");
    }
    uVar9 = (ulong)DAT_0029f3f0;
    *(uint *)((long)__s + 0xf8) = *(uint *)((long)__s + 0xf8) & 0xffffff40 | 0x98;
    uVar37 = (ulong)DAT_0029f400;
    *(ulong *)((long)__s + 0x10c) = *(ulong *)((long)__s + 0x10c) & 0xc000c00083ffffff;
    *(ulong *)((long)__s + 0x114) =
         *(ulong *)((long)__s + 0x114) & uVar37 | CONCAT44(uVar15,uVar15) & uVar9;
    *(int *)((long)__s + 0x60) = iVar33;
    *(int *)((long)__s + 100) = iVar33;
    *(int *)((long)__s + 0x68) = iVar33;
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa1,RVar16);
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa2,RVar16);
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave\n","vepu580_h264e_use_pass1_patch");
    }
  }
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    EncRcTask *rc_task = task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu580_normal(regs);
    ret = setup_vepu580_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu580_dual_core(ctx, slice->slice_type);
    setup_vepu580_codec(regs, sps, pps, slice);
    setup_vepu580_rdo_pred(regs, sps, pps, slice);
    setup_vepu580_rdo_cfg(&regs->reg_rdo);
    setup_vepu580_rdo_bias_cfg(&regs->reg_rdo, &cfg->hw);

    // scl cfg
    memcpy(&regs->reg_scl, vepu580_540_h264_flat_scl_tab, sizeof(vepu580_540_h264_flat_scl_tab));

    setup_vepu580_rc_base(regs, ctx, rc_task);
    setup_vepu580_io_buf(regs, ctx->offsets, task);
    setup_vepu580_roi(regs, ctx);
    setup_vepu580_recn_refr(ctx, regs);

    regs->reg_base.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;
    regs->reg_base.enc_pic.mei_stor = task->md_info ? 1 : 0;
    regs->reg_base.pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg_base.pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu580_split(regs, cfg);
    setup_vepu580_me(regs, sps, slice);

    if (frm_status->is_i_refresh)
        setup_vepu580_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != setup_vepu580_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    vepu580_set_osd(&ctx->osd_cfg);
    setup_vepu580_l2(regs, slice, &cfg->hw);
    setup_vepu580_ext_line_buf(regs, ctx);
    vepu580_h264e_tune_reg_patch(ctx->tune);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu580_h264e_save_pass1_patch(regs, ctx);

    if (frm->use_pass1)
        vepu580_h264e_use_pass1_patch(regs, ctx);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}